

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O2

void __thiscall
llvm::
StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
::~StringMap(StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
             *this)

{
  uint uVar1;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
  *this_00;
  ulong uVar2;
  
  if ((this->super_StringMapImpl).NumItems != 0) {
    uVar1 = (this->super_StringMapImpl).NumBuckets;
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      this_00 = (StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
                 *)(this->super_StringMapImpl).TheTable[uVar2];
      if ((this_00 !=
           (StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
            *)0xfffffffffffffff8) &&
         (this_00 !=
          (StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
           *)0x0)) {
        StringMapEntry<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>_>
        ::Destroy<llvm::MallocAllocator>(this_00,(MallocAllocator *)&this->field_0x18);
      }
    }
  }
  free((this->super_StringMapImpl).TheTable);
  return;
}

Assistant:

~StringMap() {
    // Delete all the elements in the map, but don't reset the elements
    // to default values.  This is a copy of clear(), but avoids unnecessary
    // work not required in the destructor.
    if (!empty()) {
      for (unsigned I = 0, E = NumBuckets; I != E; ++I) {
        StringMapEntryBase *Bucket = TheTable[I];
        if (Bucket && Bucket != getTombstoneVal()) {
          static_cast<MapEntryTy*>(Bucket)->Destroy(Allocator);
        }
      }
    }
    free(TheTable);
  }